

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.h
# Opt level: O2

void __thiscall duckdb_skiplistlib::skip_list::Exception::~Exception(Exception *this)

{
  *(undefined ***)this = &PTR__Exception_027d18a0;
  std::__cxx11::string::~string((string *)&this->msg);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~Exception() noexcept {}